

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O3

string * __thiscall
Lodtalk::VMContext::getClassNameOfObject_abi_cxx11_
          (string *__return_storage_ptr__,VMContext *this,Oop object)

{
  long lVar1;
  uint uVar2;
  ClassTable *this_00;
  Class *pCVar3;
  long *plVar4;
  size_type *psVar5;
  size_t index;
  string local_30;
  
  index = 0x1c;
  if (((ulong)object.field_0 & 1) == 0) {
    uVar2 = object.field_0._0_4_ & 6;
    if (uVar2 == 2) {
      index = 0x24;
    }
    else if (uVar2 == 4) {
      index = 0x20;
    }
    else {
      index = *(ulong *)object.field_0 >> 0x2a;
    }
  }
  this_00 = MemoryManager::getClassTable(this->memoryManager);
  pCVar3 = (Class *)ClassTable::getClassFromIndex(this_00,index);
  if (SUB84((pCVar3->super_ClassDescription).super_Behavior.super_Object.super_ProtoObject.
            object_header_,4) >> 10 == 0xc) {
    pCVar3 = (Class *)(pCVar3->subclasses).field_0.header;
    if (pCVar3 == (Class *)&NilObject) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"a Metaclass","");
    }
    else {
      Class::getNameString_abi_cxx11_(&local_30,pCVar3);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_30);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar5) {
        lVar1 = plVar4[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p);
      }
    }
  }
  else {
    Class::getNameString_abi_cxx11_(__return_storage_ptr__,pCVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VMContext::getClassNameOfObject(Oop object)
{
	auto classIndex = classIndexOf(object);
	auto classOop = getClassFromIndex(classIndex);
	if(classOop.header->classIndex == SCI_Metaclass)
    {
        auto meta = reinterpret_cast<Metaclass*> (classOop.pointer);
        if(!meta->thisClass.isNil())
        {
            auto clazz = reinterpret_cast<Class*> (meta->thisClass.pointer);
    		return clazz->getNameString() + " class";
        }

        return "a Metaclass";
    }

	auto clazz = reinterpret_cast<Class*> (classOop.pointer);
	return clazz->getNameString();
}